

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
ArrayState<false>::Float(ArrayState<false> *this,Context<false> *ctx,float f)

{
  Namespace<false> *in_RSI;
  BaseState<false> *in_RDI;
  feature_value in_XMM0_Da;
  char *in_stack_ffffffffffffffd8;
  
  Context<false>::CurrentNamespace((Context<false> *)0x2b5518);
  Namespace<false>::AddFeature(in_RSI,in_XMM0_Da,(feature_index)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1]._vptr_BaseState = (_func_int **)((long)in_RDI[1]._vptr_BaseState + 1);
  return in_RDI;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    if (audit)
    {
      stringstream str;
      str << '[' << (array_hash - ctx.CurrentNamespace().namespace_hash) << ']';

      ctx.CurrentNamespace().AddFeature(f, array_hash, str.str().c_str());
    }
    else
      ctx.CurrentNamespace().AddFeature(f, array_hash, nullptr);
    array_hash++;

    return this;
  }